

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzintel.cpp
# Opt level: O1

int __thiscall TPZInterpolatedElement::NSideShapeF(TPZInterpolatedElement *this,int side)

{
  int iVar1;
  undefined4 uVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  
  iVar1 = (**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl + 0x248))();
  if (iVar1 < 1) {
    iVar6 = 0;
  }
  else {
    iVar5 = 0;
    iVar6 = 0;
    do {
      uVar2 = (**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl + 0x250))
                        (this,iVar5,side);
      lVar4 = (**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl + 0xa8))
                        (this,uVar2);
      uVar2 = (**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl + 0x250))
                        (this,iVar5,side);
      iVar3 = (**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl + 0x260))
                        (this,uVar2,*(undefined1 *)(lVar4 + 0x14));
      iVar6 = iVar6 + iVar3;
      iVar5 = iVar5 + 1;
    } while (iVar1 != iVar5);
  }
  return iVar6;
}

Assistant:

int TPZInterpolatedElement::NSideShapeF(int side) const {
    int ns = NSideConnects(side);
    int in, res = 0;
    for (in = 0; in < ns; in++) {
        TPZConnect &c = Connect(SideConnectLocId(in, side));
        res += NConnectShapeF(SideConnectLocId(in, side), c.Order());
    }
    return res;
}